

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O2

string * __thiscall
cmOutputConverter::EscapeForShell
          (string *__return_storage_ptr__,cmOutputConverter *this,string *str,bool makeVars,
          bool forEcho,bool useWatcomQuote)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  size_type sVar5;
  cmState *pcVar6;
  uint flags;
  allocator local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::shellOperators_abi_cxx11_ ==
      '\0') {
    iVar4 = __cxa_guard_acquire(&cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                                 shellOperators_abi_cxx11_);
    if (iVar4 != 0) {
      cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::shellOperators_abi_cxx11_._8_4_
           = 0;
      cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::shellOperators_abi_cxx11_.
      _16_8_ = 0;
      cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::shellOperators_abi_cxx11_.
      _24_8_ = 0x657c10;
      cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::shellOperators_abi_cxx11_.
      _32_8_ = 0x657c10;
      cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::shellOperators_abi_cxx11_.
      _40_8_ = 0;
      __cxa_atexit(std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~set,cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                          shellOperators_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                           shellOperators_abi_cxx11_);
    }
  }
  if (cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::shellOperators_abi_cxx11_.
      _40_8_ == 0) {
    std::__cxx11::string::string((string *)&local_50,"<",&local_51);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                  shellOperators_abi_cxx11_,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string((string *)&local_50,">",&local_51);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                  shellOperators_abi_cxx11_,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string((string *)&local_50,"<<",&local_51);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                  shellOperators_abi_cxx11_,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string((string *)&local_50,">>",&local_51);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                  shellOperators_abi_cxx11_,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string((string *)&local_50,"|",&local_51);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                  shellOperators_abi_cxx11_,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string((string *)&local_50,"||",&local_51);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                  shellOperators_abi_cxx11_,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string((string *)&local_50,"&&",&local_51);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                  shellOperators_abi_cxx11_,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string((string *)&local_50,"&>",&local_51);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                  shellOperators_abi_cxx11_,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string((string *)&local_50,"1>",&local_51);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                  shellOperators_abi_cxx11_,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string((string *)&local_50,"2>",&local_51);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                  shellOperators_abi_cxx11_,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string((string *)&local_50,"2>&1",&local_51);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                  shellOperators_abi_cxx11_,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string((string *)&local_50,"1>&2",&local_51);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                  shellOperators_abi_cxx11_,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  sVar5 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                     shellOperators_abi_cxx11_,str);
  if (sVar5 == 0) {
    pcVar6 = cmStateSnapshot::GetState(&this->StateSnapshot);
    bVar2 = cmState::UseWindowsVSIDE(pcVar6);
    uVar3 = 2;
    if (!bVar2) {
      uVar3 = this->LinkScriptShell ^ 1;
    }
    flags = uVar3 | 0x40;
    if (!makeVars) {
      flags = uVar3;
    }
    uVar3 = flags | 4;
    if (!forEcho) {
      uVar3 = flags;
    }
    uVar1 = uVar3 | 0x80;
    if (!useWatcomQuote) {
      uVar1 = uVar3;
    }
    pcVar6 = cmStateSnapshot::GetState(&this->StateSnapshot);
    bVar2 = cmState::UseWatcomWMake(pcVar6);
    uVar3 = uVar1 | 8;
    if (!bVar2) {
      uVar3 = uVar1;
    }
    pcVar6 = cmStateSnapshot::GetState(&this->StateSnapshot);
    bVar2 = cmState::UseMinGWMake(pcVar6);
    uVar1 = uVar3 | 0x10;
    if (!bVar2) {
      uVar1 = uVar3;
    }
    pcVar6 = cmStateSnapshot::GetState(&this->StateSnapshot);
    bVar2 = cmState::UseNMake(pcVar6);
    uVar3 = uVar1 | 0x20;
    if (!bVar2) {
      uVar3 = uVar1;
    }
    pcVar6 = cmStateSnapshot::GetState(&this->StateSnapshot);
    bVar2 = cmState::UseWindowsShell(pcVar6);
    uVar1 = uVar3 | 0x100;
    if (bVar2) {
      uVar1 = uVar3;
    }
    Shell__GetArgument_abi_cxx11_
              (__return_storage_ptr__,(cmOutputConverter *)(str->_M_dataplus)._M_p,
               (char *)(ulong)uVar1,flags);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmOutputConverter::EscapeForShell(const std::string& str,
                                              bool makeVars, bool forEcho,
                                              bool useWatcomQuote) const
{
  // Do not escape shell operators.
  if (cmOutputConverterIsShellOperator(str)) {
    return str;
  }

  // Compute the flags for the target shell environment.
  int flags = 0;
  if (this->GetState()->UseWindowsVSIDE()) {
    flags |= Shell_Flag_VSIDE;
  } else if (!this->LinkScriptShell) {
    flags |= Shell_Flag_Make;
  }
  if (makeVars) {
    flags |= Shell_Flag_AllowMakeVariables;
  }
  if (forEcho) {
    flags |= Shell_Flag_EchoWindows;
  }
  if (useWatcomQuote) {
    flags |= Shell_Flag_WatcomQuote;
  }
  if (this->GetState()->UseWatcomWMake()) {
    flags |= Shell_Flag_WatcomWMake;
  }
  if (this->GetState()->UseMinGWMake()) {
    flags |= Shell_Flag_MinGWMake;
  }
  if (this->GetState()->UseNMake()) {
    flags |= Shell_Flag_NMake;
  }
  if (!this->GetState()->UseWindowsShell()) {
    flags |= Shell_Flag_IsUnix;
  }

  return Shell__GetArgument(str.c_str(), flags);
}